

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall argo::lexer::read_number(lexer *this)

{
  uint c;
  uint uVar1;
  uint c_00;
  size_t sVar2;
  undefined8 extraout_RAX;
  token_type t;
  long lVar3;
  size_t n;
  size_t local_58;
  token local_50;
  
  c = (*this->m_reader->_vptr_reader[2])();
  local_58 = 0;
  lVar3 = 1;
  if (9 < c - 0x30) {
    if (c == 0x2d) {
      c = 0x2d;
      lVar3 = 0;
      goto LAB_0011313c;
    }
    throw_number_exception(this,c);
LAB_001132c9:
    throw_number_exception(this,0x30);
    goto LAB_001132d6;
  }
LAB_0011313c:
  append_to_number_buffer(this,this->m_buffer,&local_58,c);
  uVar1 = (*this->m_reader->_vptr_reader[2])();
  while (c_00 = uVar1, c_00 - 0x30 < 10) {
    append_to_number_buffer(this,this->m_buffer,&local_58,c_00);
    lVar3 = lVar3 + 1;
    uVar1 = (*this->m_reader->_vptr_reader[2])();
    c = c_00;
  }
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)c_00);
  if (lVar3 == 1) {
LAB_001131bc:
    c_00 = (*this->m_reader->_vptr_reader[2])();
    c = c_00;
    if (c_00 == 0x2e) {
      append_to_number_buffer(this,this->m_buffer,&local_58,0x2e);
      sVar2 = read_digits(this,&local_58);
      if (sVar2 == 0) {
LAB_001132d6:
        throw_number_exception(this,0x2e);
        token::~token(&local_50);
        _Unwind_Resume(extraout_RAX);
      }
      c = (*this->m_reader->_vptr_reader[2])();
    }
    if ((c & 0xffffffdf) == 0x45) {
      append_to_number_buffer(this,this->m_buffer,&local_58,c);
      c_00 = (*this->m_reader->_vptr_reader[2])();
      if ((c_00 == 0x2d) || (c_00 == 0x2b)) {
        c = c_00;
        append_to_number_buffer(this,this->m_buffer,&local_58,c_00);
        sVar2 = read_digits(this,&local_58);
        t = number_double_e;
        if (sVar2 != 0) goto LAB_00113283;
      }
      goto LAB_0011325f;
    }
  }
  else {
    if (lVar3 != 0) {
      if (this->m_buffer[local_58 - lVar3] == '0') goto LAB_001132c9;
      goto LAB_001131bc;
    }
LAB_0011325f:
    throw_number_exception(this,c_00);
  }
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)c);
  t = c_00 == 0x2e | number_int_e;
LAB_00113283:
  token::token(&local_50,t,this->m_buffer,local_58);
  token::operator=(&this->m_token,&local_50);
  token::~token(&local_50);
  return;
}

Assistant:

void lexer::read_number()
{
    int c = m_reader.next();

    size_t n = 0;
    bool is_double = false;
    size_t num_int_digits = 0;

    // - or digit
    if (isdigit(c))
    {
        append_to_number_buffer(m_buffer, n, c);
        num_int_digits++;
    }
    else if (c == '-')
    {
        append_to_number_buffer(m_buffer, n, c);
    }
    else
    {
        throw_number_exception(c);
    }

    // some digits
    while (true)
    {
        c = m_reader.next();

        if (isdigit(c))
        {
            append_to_number_buffer(m_buffer, n, c);
            num_int_digits++;
        }
        else
        {
            m_reader.put_back(c);
            break;
        }
    }

    if (num_int_digits == 0)
    {
        // Must be at least one digit in the buffer
        throw_number_exception(c);
    }
    else if (num_int_digits > 1 && m_buffer[n - num_int_digits] == '0')
    {
        // If there's more than one digit, the first one must not be zero. No leading zeroes
        // are allowed by the standard.
        throw_number_exception('0');
    }

    c = m_reader.next();

    // maybe followed by a point
    if (c == '.')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // followed by more digits
        if (read_digits(n) == 0)
        {
            throw_number_exception(c);
        }

        c = m_reader.next();
    }

    // e/E
    if (c == 'e' || c == 'E')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // +/-
        c = m_reader.next();

        if (c == '+' || c == '-')
        {
            append_to_number_buffer(m_buffer, n, c);

            // some digits
            if (read_digits(n) == 0)
            {
                throw_number_exception(c);
            }
        }
        else 
        {
            throw_number_exception(c);
        }
    }
    else
    {
        m_reader.put_back(c);
    }

    m_token = token(is_double ? token::number_double_e : token::number_int_e, m_buffer, n);
}